

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1b_queue_count.cpp
# Opt level: O2

int main(void)

{
  istream *this;
  ostream *poVar1;
  int i;
  int iVar2;
  int k;
  int n;
  int a;
  queue<int,_std::deque<int,_std::allocator<int>_>_> q;
  int local_cc;
  int local_c8;
  int local_c4;
  _Deque_base<int,_std::allocator<int>_> local_c0;
  _Deque_base<int,_std::allocator<int>_> local_70;
  
  std::ios_base::sync_with_stdio(false);
  *(undefined8 *)(*(long *)(std::cin + -0x18) + 0x105180) = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&local_c8);
  std::istream::operator>>(this,&local_cc);
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_70);
  for (iVar2 = 0; iVar2 < local_c8; iVar2 = iVar2 + 1) {
    std::istream::operator>>((istream *)&std::cin,&local_c4);
    std::deque<int,_std::allocator<int>_>::push_back
              ((deque<int,_std::allocator<int>_> *)&local_70,&local_c4);
  }
  std::deque<int,_std::allocator<int>_>::deque
            ((deque<int,_std::allocator<int>_> *)&local_c0,
             (deque<int,_std::allocator<int>_> *)&local_70);
  qcount((queue<int,_std::deque<int,_std::allocator<int>_>_> *)&local_c0,local_cc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_c0);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_70);
  return 0;
}

Assistant:

int main() {
    // for faster cin, cout
    ios_base::sync_with_stdio(false);
    cin.tie(0);
    int n, k;
    cin >> n >> k;
    queue<int> q;
    for (int i = 0; i < n; i++) {
        int a;
        cin >> a;
        q.push(a);
    }
    cout << qcount(q, k) << endl;
}